

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.h
# Opt level: O2

string * __thiscall
TgBot::TgTypeParser::parseArray<TgBot::ShippingOption>
          (string *__return_storage_ptr__,TgTypeParser *this,
          TgTypeToJsonFunc<TgBot::ShippingOption> parseFunc,
          vector<std::shared_ptr<TgBot::ShippingOption>,_std::allocator<std::shared_ptr<TgBot::ShippingOption>_>_>
          *objects)

{
  long lVar1;
  code *pcVar2;
  char cVar3;
  long *in_R8;
  long lVar4;
  string local_50 [32];
  
  if (*in_R8 == in_R8[1]) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)local_50);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    cVar3 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar3);
    lVar1 = in_R8[1];
    for (lVar4 = *in_R8; lVar4 != lVar1; lVar4 = lVar4 + 0x10) {
      pcVar2 = (code *)parseFunc;
      if ((parseFunc & 1) != 0) {
        pcVar2 = *(code **)(*(long *)(this + (long)objects) + -1 + parseFunc);
      }
      (*pcVar2)(local_50,this + (long)objects,lVar4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::push_back(cVar3);
    }
    std::__cxx11::string::erase
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length - 1);
    std::__cxx11::string::push_back(cVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string parseArray(TgTypeToJsonFunc<T> parseFunc, const std::vector<std::shared_ptr<T>>& objects) const {
        if (objects.empty())
            return "";
        std::string result;
        result += '[';
        for (const std::shared_ptr<T>& item : objects) {
            result += (this->*parseFunc)(item);
            result += ',';
        }
        result.erase(result.length() - 1);
        result += ']';
        return result;
    }